

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O0

ssize_t __thiscall Pl_TIFFPredictor::write(Pl_TIFFPredictor *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  size_type sVar2;
  iterator iVar3;
  undefined4 in_register_00000034;
  size_t sVar4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  const_iterator local_50;
  uchar *local_48;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  const_iterator local_38;
  uchar *local_30;
  uchar *row_end;
  uchar *end;
  size_t len_local;
  uchar *data_local;
  Pl_TIFFPredictor *this_local;
  
  sVar4 = CONCAT44(in_register_00000034,__fd);
  row_end = (uchar *)(sVar4 + (long)__buf);
  uVar1 = this->bytes_per_row;
  end = (uchar *)__buf;
  len_local = sVar4;
  data_local = (uchar *)this;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->cur_row);
  local_30 = (uchar *)(sVar4 + (uVar1 - sVar2));
  while (local_30 <= row_end) {
    local_40._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->cur_row);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_38,&local_40);
    local_48 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<unsigned_char_const*,void>
                                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                   &this->cur_row,local_38,(uchar *)len_local,local_30);
    len_local = (size_t)local_30;
    local_30 = local_30 + this->bytes_per_row;
    processRow(this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->cur_row);
  }
  local_58._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->cur_row);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_50,&local_58);
  iVar3 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->cur_row,local_50,
                     (uchar *)len_local,row_end);
  return (ssize_t)iVar3._M_current;
}

Assistant:

void
Pl_TIFFPredictor::write(unsigned char const* data, size_t len)
{
    auto end = data + len;
    auto row_end = data + (bytes_per_row - cur_row.size());
    while (row_end <= end) {
        // finish off current row
        cur_row.insert(cur_row.end(), data, row_end);
        data = row_end;
        row_end += bytes_per_row;

        processRow();

        // Prepare for next row
        cur_row.clear();
    }

    cur_row.insert(cur_row.end(), data, end);
}